

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void UA_SecureChannel_deleteMembersCleanup(UA_SecureChannel *channel)

{
  UA_Connection *pUVar1;
  UA_SecureChannel *pUVar2;
  SessionEntry *pSVar3;
  SessionEntry **ppSVar4;
  ChunkEntry *pCVar5;
  ChunkEntry *pCVar6;
  ChunkEntry **ppCVar7;
  ChunkEntry *__ptr;
  SessionEntry *__ptr_00;
  
  deleteMembers_noInit(&channel->serverAsymAlgSettings,UA_TRANSPORT + 5);
  (channel->serverAsymAlgSettings).receiverCertificateThumbprint.length = 0;
  (channel->serverAsymAlgSettings).receiverCertificateThumbprint.data = (UA_Byte *)0x0;
  (channel->serverAsymAlgSettings).senderCertificate.length = 0;
  (channel->serverAsymAlgSettings).senderCertificate.data = (UA_Byte *)0x0;
  (channel->serverAsymAlgSettings).securityPolicyUri.length = 0;
  (channel->serverAsymAlgSettings).securityPolicyUri.data = (UA_Byte *)0x0;
  deleteMembers_noInit(&channel->serverNonce,UA_TYPES + 0xe);
  (channel->serverNonce).length = 0;
  (channel->serverNonce).data = (UA_Byte *)0x0;
  deleteMembers_noInit(&channel->clientAsymAlgSettings,UA_TRANSPORT + 5);
  (channel->clientAsymAlgSettings).receiverCertificateThumbprint.length = 0;
  (channel->clientAsymAlgSettings).receiverCertificateThumbprint.data = (UA_Byte *)0x0;
  (channel->clientAsymAlgSettings).senderCertificate.length = 0;
  (channel->clientAsymAlgSettings).senderCertificate.data = (UA_Byte *)0x0;
  (channel->clientAsymAlgSettings).securityPolicyUri.length = 0;
  (channel->clientAsymAlgSettings).securityPolicyUri.data = (UA_Byte *)0x0;
  deleteMembers_noInit(&channel->clientNonce,UA_TYPES + 0xe);
  (channel->clientNonce).length = 0;
  (channel->clientNonce).data = (UA_Byte *)0x0;
  pUVar1 = channel->connection;
  if (pUVar1 != (UA_Connection *)0x0) {
    pUVar2 = pUVar1->channel;
    if ((pUVar2 != (UA_SecureChannel *)0x0) && (pUVar2->connection == pUVar1)) {
      pUVar2->connection = (UA_Connection *)0x0;
    }
    pUVar1->channel = (UA_SecureChannel *)0x0;
  }
  __ptr_00 = (channel->sessions).lh_first;
  if (__ptr_00 != (SessionEntry *)0x0) {
    while( true ) {
      pSVar3 = (__ptr_00->pointers).le_next;
      if (__ptr_00->session != (UA_Session *)0x0) {
        __ptr_00->session->channel = (UA_SecureChannel *)0x0;
      }
      ppSVar4 = (__ptr_00->pointers).le_prev;
      if (pSVar3 == (SessionEntry *)0x0) break;
      (pSVar3->pointers).le_prev = ppSVar4;
      *ppSVar4 = pSVar3;
      free(__ptr_00);
      __ptr_00 = pSVar3;
    }
    *ppSVar4 = (SessionEntry *)0x0;
    free(__ptr_00);
  }
  __ptr = (channel->chunks).lh_first;
  while (__ptr != (ChunkEntry *)0x0) {
    pCVar5 = (__ptr->pointers).le_next;
    deleteMembers_noInit(&__ptr->bytes,UA_TYPES + 0xe);
    pCVar6 = (__ptr->pointers).le_next;
    ppCVar7 = (__ptr->pointers).le_prev;
    if (pCVar6 != (ChunkEntry *)0x0) {
      (pCVar6->pointers).le_prev = ppCVar7;
    }
    *ppCVar7 = pCVar6;
    free(__ptr);
    __ptr = pCVar5;
  }
  return;
}

Assistant:

void UA_SecureChannel_deleteMembersCleanup(UA_SecureChannel *channel) {
    /* Delete members */
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->serverAsymAlgSettings);
    UA_ByteString_deleteMembers(&channel->serverNonce);
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->clientAsymAlgSettings);
    UA_ByteString_deleteMembers(&channel->clientNonce);
    UA_ChannelSecurityToken_deleteMembers(&channel->securityToken);
    UA_ChannelSecurityToken_deleteMembers(&channel->nextSecurityToken);

    /* Detach from the channel */
    if(channel->connection)
        UA_Connection_detachSecureChannel(channel->connection);

    /* Remove session pointers (not the sessions) */
    struct SessionEntry *se, *temp;
    LIST_FOREACH_SAFE(se, &channel->sessions, pointers, temp) {
        if(se->session)
            se->session->channel = NULL;
        LIST_REMOVE(se, pointers);
        UA_free(se);
    }

    /* Remove the buffered chunks */
    struct ChunkEntry *ch, *temp_ch;
    LIST_FOREACH_SAFE(ch, &channel->chunks, pointers, temp_ch) {
        UA_ByteString_deleteMembers(&ch->bytes);
        LIST_REMOVE(ch, pointers);
        UA_free(ch);
    }
}